

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  short sVar8;
  int iVar9;
  uint *z;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  DateTime x;
  DateTime DStack_68;
  undefined1 local_38;
  uint local_37;
  undefined1 local_33;
  char local_32;
  char local_31;
  undefined1 local_30;
  char local_2f;
  char local_2e;
  undefined1 local_2d;
  long local_28;
  byte bVar2;
  char cVar3;
  char cVar4;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = isDate(context,argc,argv,&DStack_68);
  if (iVar9 == 0) {
    computeYMD(&DStack_68);
    uVar7 = -DStack_68.Y;
    if (0 < DStack_68.Y) {
      uVar7 = DStack_68.Y;
    }
    cVar3 = (char)(DStack_68.M / 10);
    local_32 = cVar3 + (char)((DStack_68.M / 10) / 10) * -10 + '0';
    local_31 = (char)DStack_68.M + cVar3 * -10 + '0';
    cVar3 = (char)(DStack_68.D / 10);
    local_2f = cVar3 + (char)((DStack_68.D / 10) / 10) * -10 + '0';
    local_2e = (char)DStack_68.D + cVar3 * -10 + '0';
    auVar10._0_4_ = (uVar7 / 1000) % 10;
    auVar10._4_4_ = (uVar7 / 100) % 10;
    auVar10._8_4_ = (uVar7 / 10) % 10;
    auVar10._12_4_ = uVar7 % 10;
    auVar10 = auVar10 & _DAT_001a4900;
    uVar5 = auVar10._0_2_;
    bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * auVar10[0] - (0xff < uVar5);
    uVar5 = auVar10._4_2_;
    bVar2 = (uVar5 != 0) * (uVar5 < 0x100) * auVar10[4] - (0xff < uVar5);
    sVar6 = auVar10._8_2_;
    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar10[8] - (0xff < sVar6);
    sVar6 = auVar10._10_2_;
    sVar8 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar10[10] - (0xff < sVar6),cVar3);
    sVar6 = auVar10._12_2_;
    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar10[0xc] - (0xff < sVar6);
    sVar6 = auVar10._14_2_;
    sVar6 = (short)(CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar10[0xe] - (0xff < sVar6),
                             CONCAT12(cVar4,sVar8)) >> 0x10);
    local_37 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * cVar4 - (0xff < sVar6),
                        CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8),
                                 CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                          (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))))
               | (uint)DAT_001a4910;
    local_33 = 0x2d;
    local_30 = 0x2d;
    local_2d = 0;
    if (DStack_68.Y < 0) {
      z = (uint *)&local_38;
      local_38 = 0x2d;
      iVar9 = 0xb;
    }
    else {
      z = &local_37;
      iVar9 = 10;
    }
    setResultStrOrError(context,(char *)z,iVar9,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}